

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

char * SkipCardDetailsInName(char *infoSkipName,char *cardRefName)

{
  bool bVar1;
  char *local_28;
  char *lastSpacePosn;
  char *cardRefName_local;
  char *infoSkipName_local;
  
  lastSpacePosn = cardRefName;
  cardRefName_local = infoSkipName;
  while (local_28 = cardRefName_local, *lastSpacePosn != '\0') {
    while( true ) {
      bVar1 = false;
      if ((*cardRefName_local != '\0') && (bVar1 = false, *lastSpacePosn != '\0')) {
        bVar1 = *cardRefName_local == *lastSpacePosn;
      }
      if (!bVar1) break;
      cardRefName_local = cardRefName_local + 1;
      lastSpacePosn = lastSpacePosn + 1;
      if ((*cardRefName_local == ' ') || (*cardRefName_local == '\0')) {
        local_28 = cardRefName_local;
      }
    }
    cardRefName_local = local_28;
    do {
      bVar1 = false;
      if (*lastSpacePosn != '\0') {
        bVar1 = *lastSpacePosn != ' ';
        lastSpacePosn = lastSpacePosn + 1;
      }
    } while (bVar1);
  }
  local_28 = cardRefName_local;
  if (*cardRefName_local == '\0') {
    infoSkipName_local = "-";
  }
  else {
    while( true ) {
      bVar1 = false;
      if (*local_28 != '\0') {
        bVar1 = *local_28 == ' ';
      }
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
    if (((*local_28 == '-') || (*local_28 == ':')) && (local_28[1] == ' ')) {
      local_28 = local_28 + 2;
    }
    infoSkipName_local = local_28;
  }
  return infoSkipName_local;
}

Assistant:

static char *SkipCardDetailsInName( char *infoSkipName, char *cardRefName )
{
    char *lastSpacePosn = infoSkipName;

    /* Skip matching chars; but only in chunks separated by ' ' (not part words etc), so track lastSpacePosn */
    while( *cardRefName )
    {
        while( *infoSkipName && *cardRefName && *infoSkipName == *cardRefName)
        {
            infoSkipName++;
            cardRefName++;
            if( *infoSkipName == ' ' || *infoSkipName == '\0' )
                lastSpacePosn = infoSkipName;
        }
        infoSkipName = lastSpacePosn;
        /* Look for another chunk; post-increment means ends pointing to next char */
        while( *cardRefName && ( *cardRefName++ != ' ' ));
    }
    if( *infoSkipName == '\0' )
        return "-"; /* The 2 names were identical; instead of a nul-string, return a marker string */

    /* Now want to move to the first char after any spaces */
    while( *lastSpacePosn && *lastSpacePosn == ' ' )
        lastSpacePosn++;
    /* Skip a single separator char if present in the remaining pcm name; (pa will add its own) */
    if(( *lastSpacePosn == '-' || *lastSpacePosn == ':' ) && *(lastSpacePosn + 1) == ' ' )
        lastSpacePosn += 2;

    return lastSpacePosn;
}